

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_from_curvature(REF_DBL *metric,REF_GRID ref_grid)

{
  uint uVar1;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  REF_DBL local_2b0;
  double local_2a8;
  double local_2a0;
  double local_290;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_BOOL usable;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL scale;
  REF_DBL ramp;
  REF_DBL crease_dot_prod;
  REF_DBL norm_ratio;
  REF_DBL curvature_ratio;
  REF_DBL aspect_ratio;
  REF_DBL slop;
  REF_DBL hn;
  REF_DBL hs;
  REF_DBL hr;
  REF_DBL rlimit;
  REF_DBL hmax;
  REF_DBL delta_radian;
  REF_INT i;
  REF_DBL curvature_metric [6];
  REF_DBL previous_metric [6];
  REF_DBL diagonal_system [12];
  REF_DBL n [3];
  REF_DBL local_88;
  REF_DBL s [3];
  REF_DBL ks;
  REF_DBL r [3];
  double local_48;
  REF_DBL kr;
  int local_38;
  REF_INT face;
  REF_INT node;
  REF_INT geom;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  _node = ref_grid->geom;
  rlimit = 1e+200;
  ref_node = (REF_NODE)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  if (_node->model == (void *)0x0) {
    if (_node->meshlink == (void *)0x0) {
      printf("\nNo geometry model, did you forget to load it?\n\n");
      ref_private_macro_code_rss_4 = 6;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x53b,"ref_metric_from_curvature",6,"...or implement non-CAD curvature estimate");
      return ref_private_macro_code_rss_4;
    }
    ref_private_macro_code_rss_3 = ref_node_bounding_box_diagonal((REF_NODE)ref_geom,&rlimit);
    if (ref_private_macro_code_rss_3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x538,"ref_metric_from_curvature",(ulong)(uint)ref_private_macro_code_rss_3,"bbox diag"
            );
      return ref_private_macro_code_rss_3;
    }
    ref_private_macro_code_rss_3 = 0;
  }
  else {
    ref_private_macro_code_rss_2 = ref_egads_diagonal(_node,-1,&rlimit);
    if (ref_private_macro_code_rss_2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x536,"ref_metric_from_curvature",(ulong)(uint)ref_private_macro_code_rss_2,
             "egads bbox diag");
      return ref_private_macro_code_rss_2;
    }
    ref_private_macro_code_rss_2 = 0;
  }
  if (1.0 < _node->segments_per_bounding_box_diagonal ||
      _node->segments_per_bounding_box_diagonal == 1.0) {
    local_240 = _node->segments_per_bounding_box_diagonal;
  }
  else {
    local_240 = 1.0;
  }
  rlimit = rlimit / local_240;
  curvature_ratio = 20.0;
  norm_ratio = 0.05;
  crease_dot_prod = 2.0;
  for (local_38 = 0; local_38 < ref_geom->max; local_38 = local_38 + 1) {
    if ((((-1 < local_38) && (local_38 < ref_geom->max)) &&
        (-1 < *(long *)(ref_geom->descr + (long)local_38 * 2))) &&
       (*(int *)((long)ref_geom->tolerance_protection + 4) ==
        *(int *)((long)ref_geom->initial_cell_height + (long)local_38 * 4))) {
      if (_node->model == (void *)0x0) {
        ref_grid_local->cell[(long)(local_38 * 6) + -2] = (REF_CELL)((1.0 / rlimit) / rlimit);
        ref_grid_local->cell[(long)(local_38 * 6 + 1) + -2] = (REF_CELL)0x0;
        ref_grid_local->cell[(long)(local_38 * 6 + 2) + -2] = (REF_CELL)0x0;
        ref_grid_local->cell[(long)(local_38 * 6 + 3) + -2] = (REF_CELL)((1.0 / rlimit) / rlimit);
        ref_grid_local->cell[(long)(local_38 * 6 + 4) + -2] = (REF_CELL)0x0;
        ref_grid_local->cell[(long)(local_38 * 6 + 5) + -2] = (REF_CELL)((1.0 / rlimit) / rlimit);
      }
      else {
        ref_private_macro_code_rss_5 =
             ref_egads_feature_size
                       ((REF_GRID_conflict)ref_node,local_38,&hs,&ks,&hn,&local_88,&slop,
                        diagonal_system + 0xb);
        if (ref_private_macro_code_rss_5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x54b,"ref_metric_from_curvature",(ulong)(uint)ref_private_macro_code_rss_5,
                 "feature size");
          return ref_private_macro_code_rss_5;
        }
        if (hs * curvature_ratio <= hn) {
          local_248 = hs * curvature_ratio;
        }
        else {
          local_248 = hn;
        }
        hn = local_248;
        if (crease_dot_prod * hs <= slop) {
          local_250 = crease_dot_prod * hs;
        }
        else {
          local_250 = slop;
        }
        if (crease_dot_prod * local_248 <= local_250) {
          local_258 = crease_dot_prod * local_248;
        }
        else {
          local_258 = local_250;
        }
        slop = local_258;
        for (delta_radian._4_4_ = 0; delta_radian._4_4_ < 3;
            delta_radian._4_4_ = delta_radian._4_4_ + 1) {
          previous_metric[(long)(delta_radian._4_4_ + 3) + 5] = r[(long)delta_radian._4_4_ + -1];
        }
        previous_metric[5] = (1.0 / hs) / hs;
        for (delta_radian._4_4_ = 0; delta_radian._4_4_ < 3;
            delta_radian._4_4_ = delta_radian._4_4_ + 1) {
          previous_metric[(long)(delta_radian._4_4_ + 6) + 5] = s[(long)delta_radian._4_4_ + -1];
        }
        diagonal_system[0] = (1.0 / local_248) / local_248;
        for (delta_radian._4_4_ = 0; delta_radian._4_4_ < 3;
            delta_radian._4_4_ = delta_radian._4_4_ + 1) {
          previous_metric[(long)(delta_radian._4_4_ + 9) + 5] =
               diagonal_system[(long)delta_radian._4_4_ + 0xb];
        }
        diagonal_system[1] = (1.0 / local_258) / local_258;
        ref_private_macro_code_rxs =
             ref_matrix_form_m(previous_metric + 5,
                               (REF_DBL *)(ref_grid_local->cell + (long)(local_38 * 6) + -2));
        if (ref_private_macro_code_rxs != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x555,"ref_metric_from_curvature",(ulong)(uint)ref_private_macro_code_rxs,"form m")
          ;
          return ref_private_macro_code_rxs;
        }
        ref_private_macro_code_rxs = 0;
      }
    }
  }
  for (face = 0; face < _node->max; face = face + 1) {
    if ((_node->descr[face * 6] == 2) &&
       (local_38 = _node->descr[face * 6 + 5],
       *(int *)((long)ref_geom->tolerance_protection + 4) ==
       *(int *)((long)ref_geom->initial_cell_height + (long)local_38 * 4))) {
      kr._4_4_ = _node->descr[face * 6 + 1] + -1;
      ref_private_macro_code_rss_6 = ref_geom_radian_request(_node,face,&hmax);
      if (ref_private_macro_code_rss_6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x565,"ref_metric_from_curvature",(ulong)(uint)ref_private_macro_code_rss_6,"drad");
        return ref_private_macro_code_rss_6;
      }
      hr = rlimit / hmax;
      if (_node->model == (void *)0x0) {
        if (_node->meshlink == (void *)0x0) goto LAB_0022b06e;
        ref_private_macro_code_rss_7 =
             ref_meshlink_face_curvature((REF_GRID)ref_node,face,&local_48,&ks,s + 2,&local_88);
        if (ref_private_macro_code_rss_7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x56c,"ref_metric_from_curvature",(ulong)(uint)ref_private_macro_code_rss_7,"curve"
                );
          return ref_private_macro_code_rss_7;
        }
        ref_private_macro_code_rss_7 = 0;
      }
      else {
        usable = ref_egads_face_curvature(_node,face,&local_48,&ks,s + 2,&local_88);
        if ((usable != 0) && (usable != 1)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x569,"ref_metric_from_curvature",(ulong)(uint)usable,"curve");
          return usable;
        }
      }
      if (local_48 <= 0.0) {
        local_260 = -local_48;
      }
      else {
        local_260 = local_48;
      }
      if (s[2] <= 0.0) {
        local_268 = -s[2];
      }
      else {
        local_268 = s[2];
      }
      if (local_260 <= norm_ratio * local_268) {
        local_270 = norm_ratio * local_268;
      }
      else {
        local_270 = local_260;
      }
      local_48 = local_270;
      if (local_268 <= norm_ratio * local_270) {
        local_278 = norm_ratio * local_270;
      }
      else {
        local_278 = local_268;
      }
      s[2] = local_278;
      hs = rlimit;
      if (1.0 / hr < local_270) {
        hs = hmax / local_270;
      }
      hn = rlimit;
      if (1.0 / hr < local_278) {
        hn = hmax / local_278;
      }
      if (_node->model == (void *)0x0) {
        if (_node->meshlink == (void *)0x0) {
          aspect_ratio = rlimit * 1e-05;
        }
        else {
          uVar1 = ref_meshlink_gap((REF_GRID)ref_node,local_38,&aspect_ratio);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x581,"ref_metric_from_curvature",(ulong)uVar1,"edge tol");
            return uVar1;
          }
          aspect_ratio = _node->gap_protection * aspect_ratio;
        }
      }
      else {
        uVar1 = ref_geom_usable(_node,face,&ref_private_macro_code_rss_8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x57d,"ref_metric_from_curvature",(ulong)uVar1,"useable curvature");
          return uVar1;
        }
        if (ref_private_macro_code_rss_8 == 0) goto LAB_0022b06e;
        uVar1 = ref_geom_reliability(_node,face,&aspect_ratio);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x57f,"ref_metric_from_curvature",(ulong)uVar1,"edge tol");
          return uVar1;
        }
      }
      if ((aspect_ratio <= hs) && (aspect_ratio <= hn)) {
        if ((kr._4_4_ < 0) ||
           ((_node->nface <= kr._4_4_ || (_node->face_min_length == (REF_DBL *)0x0)))) {
          local_280 = -1.0;
        }
        else {
          local_280 = _node->face_min_length[kr._4_4_];
        }
        if (local_280 <= 0.0) {
LAB_0022abe8:
          slop = rlimit;
          if (((kr._4_4_ < 0) || (_node->nface <= kr._4_4_)) ||
             (_node->initial_cell_height == (REF_DBL *)0x0)) {
            local_2a8 = -1.0;
          }
          else {
            local_2a8 = _node->initial_cell_height[kr._4_4_];
          }
          if (0.0 < local_2a8) {
            if (((kr._4_4_ < 0) || (_node->nface <= kr._4_4_)) ||
               (_node->initial_cell_height == (REF_DBL *)0x0)) {
              local_2b0 = -1.0;
            }
            else {
              local_2b0 = _node->initial_cell_height[kr._4_4_];
            }
            slop = local_2b0;
          }
          if (crease_dot_prod * hs <= slop) {
            local_2b8 = crease_dot_prod * hs;
          }
          else {
            local_2b8 = slop;
          }
          if (crease_dot_prod * hn <= local_2b8) {
            local_2c0 = crease_dot_prod * hn;
          }
          else {
            local_2c0 = local_2b8;
          }
          slop = local_2c0;
          diagonal_system[0xb] = r[0] * s[1] + -(r[1] * s[0]);
          for (delta_radian._4_4_ = 0; delta_radian._4_4_ < 3;
              delta_radian._4_4_ = delta_radian._4_4_ + 1) {
            previous_metric[(long)(delta_radian._4_4_ + 3) + 5] = r[(long)delta_radian._4_4_ + -1];
          }
          previous_metric[5] = (1.0 / hs) / hs;
          for (delta_radian._4_4_ = 0; delta_radian._4_4_ < 3;
              delta_radian._4_4_ = delta_radian._4_4_ + 1) {
            previous_metric[(long)(delta_radian._4_4_ + 6) + 5] = s[(long)delta_radian._4_4_ + -1];
          }
          diagonal_system[0] = (1.0 / hn) / hn;
          for (delta_radian._4_4_ = 0; delta_radian._4_4_ < 3;
              delta_radian._4_4_ = delta_radian._4_4_ + 1) {
            previous_metric[(long)(delta_radian._4_4_ + 9) + 5] =
                 diagonal_system[(long)delta_radian._4_4_ + 0xb];
          }
          diagonal_system[1] = (1.0 / local_2c0) / local_2c0;
          uVar1 = ref_matrix_form_m(previous_metric + 5,(REF_DBL *)&stack0xfffffffffffffe98);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x59c,"ref_metric_from_curvature",(ulong)uVar1,"reform m");
            return uVar1;
          }
          for (delta_radian._4_4_ = 0; delta_radian._4_4_ < 6;
              delta_radian._4_4_ = delta_radian._4_4_ + 1) {
            curvature_metric[(long)delta_radian._4_4_ + 5] =
                 (REF_DBL)ref_grid_local->cell[(long)(delta_radian._4_4_ + local_38 * 6) + -2];
          }
          uVar1 = ref_matrix_intersect
                            (curvature_metric + 5,(REF_DBL *)&stack0xfffffffffffffe98,
                             (REF_DBL *)(ref_grid_local->cell + (long)(local_38 * 6) + -2));
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x5a0,"ref_metric_from_curvature",(ulong)uVar1,"intersect to update metric");
            return uVar1;
          }
        }
        else {
          if (((kr._4_4_ < 0) || (_node->nface <= kr._4_4_)) ||
             (_node->face_min_length == (REF_DBL *)0x0)) {
            local_290 = -1.0;
          }
          else {
            local_290 = _node->face_min_length[kr._4_4_];
          }
          if (local_290 <= hs) {
            if (((kr._4_4_ < 0) || (_node->nface <= kr._4_4_)) ||
               (_node->face_min_length == (REF_DBL *)0x0)) {
              local_2a0 = -1.0;
            }
            else {
              local_2a0 = _node->face_min_length[kr._4_4_];
            }
            if (local_2a0 <= hn) goto LAB_0022abe8;
          }
        }
      }
    }
LAB_0022b06e:
  }
  face = 0;
  do {
    if (_node->max <= face) {
      if ((int)ref_node[1].old_n_global != 0) {
        for (local_38 = 0; local_38 < ref_geom->max; local_38 = local_38 + 1) {
          if (((-1 < local_38) && (local_38 < ref_geom->max)) &&
             ((-1 < *(long *)(ref_geom->descr + (long)local_38 * 2) &&
              ((*(int *)((long)ref_geom->tolerance_protection + 4) ==
                *(int *)((long)ref_geom->initial_cell_height + (long)local_38 * 4) &&
               (uVar1 = ref_matrix_twod_m((REF_DBL *)
                                          (ref_grid_local->cell + (long)(local_38 * 6) + -2)),
               uVar1 != 0)))))) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x5e3,"ref_metric_from_curvature",(ulong)uVar1,"enforce twod");
            return uVar1;
          }
        }
      }
      metric_local._4_4_ = ref_node_ghost_dbl((REF_NODE)ref_geom,(REF_DBL *)ref_grid_local,6);
      if (metric_local._4_4_ == 0) {
        metric_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x5e8,"ref_metric_from_curvature",(ulong)metric_local._4_4_,"update ghosts");
      }
      return metric_local._4_4_;
    }
    if ((_node->descr[face * 6] == 1) &&
       (local_38 = _node->descr[face * 6 + 5],
       *(int *)((long)ref_geom->tolerance_protection + 4) ==
       *(int *)((long)ref_geom->initial_cell_height + (long)local_38 * 4))) {
      uVar1 = ref_geom_radian_request(_node,face,&hmax);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x5a7,"ref_metric_from_curvature",(ulong)uVar1,"drad");
        return uVar1;
      }
      hr = rlimit / hmax;
      if (_node->model == (void *)0x0) {
        if (_node->meshlink == (void *)0x0) goto LAB_0022b722;
        uVar1 = ref_meshlink_edge_curvature((REF_GRID)ref_node,face,&local_48,&ks);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x5ac,"ref_metric_from_curvature",(ulong)uVar1,"curve");
          return uVar1;
        }
      }
      else {
        uVar1 = ref_egads_edge_curvature(_node,face,&local_48,&ks);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x5aa,"ref_metric_from_curvature",(ulong)uVar1,"curve");
          return uVar1;
        }
      }
      if (local_48 <= 0.0) {
        local_2c8 = -local_48;
      }
      else {
        local_2c8 = local_48;
      }
      local_48 = local_2c8;
      hs = rlimit;
      if (1.0 / hr < local_2c8) {
        hs = hmax / local_2c8;
      }
      if (_node->model == (void *)0x0) {
        if (_node->meshlink == (void *)0x0) {
          aspect_ratio = rlimit * 1e-05;
        }
        else {
          uVar1 = ref_meshlink_gap((REF_GRID)ref_node,local_38,&aspect_ratio);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x5b8,"ref_metric_from_curvature",(ulong)uVar1,"edge tol");
            return uVar1;
          }
          aspect_ratio = _node->gap_protection * aspect_ratio;
        }
      }
      else {
        uVar1 = ref_geom_reliability(_node,face,&aspect_ratio);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x5b6,"ref_metric_from_curvature",(ulong)uVar1,"edge tol");
          return uVar1;
        }
      }
      if (aspect_ratio <= hs) {
        if (_node->model != (void *)0x0) {
          uVar1 = ref_geom_crease((REF_GRID_conflict)ref_node,local_38,&ramp);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x5c0,"ref_metric_from_curvature",(ulong)uVar1,"crease");
            return uVar1;
          }
          if (ramp < -0.8) {
            scale = (-ramp - 0.8) / 0.2;
            _ref_private_macro_code_rss_1 = scale * 0.25 + (1.0 - scale) * 1.0;
            hs = _ref_private_macro_code_rss_1 * hs;
          }
        }
        diagonal_system[2] = 1.0;
        diagonal_system[3] = 0.0;
        diagonal_system[4] = 0.0;
        previous_metric[5] = (1.0 / hs) / hs;
        diagonal_system[5] = 0.0;
        diagonal_system[6] = 1.0;
        diagonal_system[7] = 0.0;
        diagonal_system[0] = (1.0 / hs) / hs;
        diagonal_system[8] = 0.0;
        diagonal_system[9] = 0.0;
        diagonal_system[10] = 1.0;
        diagonal_system[1] = (1.0 / hs) / hs;
        uVar1 = ref_matrix_form_m(previous_metric + 5,(REF_DBL *)&stack0xfffffffffffffe98);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x5d8,"ref_metric_from_curvature",(ulong)uVar1,"reform m");
          return uVar1;
        }
        for (delta_radian._4_4_ = 0; delta_radian._4_4_ < 6;
            delta_radian._4_4_ = delta_radian._4_4_ + 1) {
          curvature_metric[(long)delta_radian._4_4_ + 5] =
               (REF_DBL)ref_grid_local->cell[(long)(delta_radian._4_4_ + local_38 * 6) + -2];
        }
        uVar1 = ref_matrix_intersect
                          (curvature_metric + 5,(REF_DBL *)&stack0xfffffffffffffe98,
                           (REF_DBL *)(ref_grid_local->cell + (long)(local_38 * 6) + -2));
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x5dc,"ref_metric_from_curvature",(ulong)uVar1,"intersect to update metric");
          return uVar1;
        }
      }
    }
LAB_0022b722:
    face = face + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_from_curvature(REF_DBL *metric,
                                             REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom, node, face;
  REF_DBL kr, r[3], ks, s[3], n[3];
  REF_DBL diagonal_system[12];
  REF_DBL previous_metric[6], curvature_metric[6];
  REF_INT i;
  REF_DBL delta_radian; /* 1/segments per radian */
  REF_DBL hmax = REF_DBL_MAX;
  REF_DBL rlimit;
  REF_DBL hr, hs, hn, slop;
  REF_DBL aspect_ratio, curvature_ratio, norm_ratio;
  REF_DBL crease_dot_prod, ramp, scale;

  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, &hmax), "egads bbox diag");
  } else if (ref_geom_meshlinked(ref_geom)) {
    RSS(ref_node_bounding_box_diagonal(ref_node, &hmax), "bbox diag");
  } else {
    printf("\nNo geometry model, did you forget to load it?\n\n");
    RSS(REF_IMPLEMENT, "...or implement non-CAD curvature estimate");
  }
  /* normal spacing and max tangential spacing */
  hmax /= MAX(1.0, ref_geom_segments_per_bounding_box_diagonal(ref_geom));

  /* limit aspect ratio via curvature */
  aspect_ratio = 20.0;
  curvature_ratio = 1.0 / aspect_ratio;

  /* limit normal direction to a factor of surface spacing */
  norm_ratio = 2.0;

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_egads_feature_size(ref_grid, node, &hr, r, &hs, s, &hn, n),
            "feature size");
        hs = MIN(hs, hr * aspect_ratio);
        hn = MIN(hn, norm_ratio * hr);
        hn = MIN(hn, norm_ratio * hs);
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 0) = r[i];
        ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 1) = s[i];
        ref_matrix_eig(diagonal_system, 1) = 1.0 / hs / hs;
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 2) = n[i];
        ref_matrix_eig(diagonal_system, 2) = 1.0 / hn / hn;
        RSS(ref_matrix_form_m(diagonal_system, &(metric[6 * node])), "form m");
      } else {
        metric[0 + 6 * node] = 1.0 / hmax / hmax;
        metric[1 + 6 * node] = 0.0;
        metric[2 + 6 * node] = 0.0;
        metric[3 + 6 * node] = 1.0 / hmax / hmax;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0 / hmax / hmax;
      }
    }
  }

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_node_owned(ref_node, node)) {
      face = ref_geom_id(ref_geom, geom) - 1;
      RSS(ref_geom_radian_request(ref_geom, geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      if (ref_geom_model_loaded(ref_geom)) {
        RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s),
            REF_FAILURE, "curve");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s),
            "curve");
      } else {
        continue;
      }
      /* ignore sign, curvature is 1 / radius */
      kr = ABS(kr);
      ks = ABS(ks);
      /* limit the aspect ratio of the metric by reducing the largest radius */
      kr = MAX(kr, curvature_ratio * ks);
      ks = MAX(ks, curvature_ratio * kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;
      hs = hmax;
      if (1.0 / rlimit < ks) hs = delta_radian / ks;

      if (ref_geom_model_loaded(ref_geom)) {
        REF_BOOL usable;
        RSS(ref_geom_usable(ref_geom, geom, &usable), "useable curvature");
        if (!usable) continue;
        RSS(ref_geom_reliability(ref_geom, geom, &slop), "edge tol");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_gap(ref_grid, node, &slop), "edge tol");
        slop *= ref_geom_gap_protection(ref_geom);
      } else {
        slop = 1.0e-5 * hmax;
      }
      if (hr < slop || hs < slop) continue;
      if (0.0 < ref_geom_face_min_length(ref_geom, face)) {
        if (hr < ref_geom_face_min_length(ref_geom, face) ||
            hs < ref_geom_face_min_length(ref_geom, face))
          continue;
      }

      hn = hmax;
      if (0.0 < ref_geom_face_initial_cell_height(ref_geom, face))
        hn = ref_geom_face_initial_cell_height(ref_geom, face);
      hn = MIN(hn, norm_ratio * hr);
      hn = MIN(hn, norm_ratio * hs);

      /* cross the tangent vectors to get the (inward or outward) normal */
      ref_math_cross_product(r, s, n);
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 0) = r[i];
      ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 1) = s[i];
      ref_matrix_eig(diagonal_system, 1) = 1.0 / hs / hs;
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 2) = n[i];
      ref_matrix_eig(diagonal_system, 2) = 1.0 / hn / hn;
      /* form and intersect with previous */
      RSS(ref_matrix_form_m(diagonal_system, curvature_metric), "reform m");
      for (i = 0; i < 6; i++) previous_metric[i] = metric[i + 6 * node];
      RSS(ref_matrix_intersect(previous_metric, curvature_metric,
                               &(metric[6 * node])),
          "intersect to update metric");
    }
  }

  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_geom_radian_request(ref_geom, geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_egads_edge_curvature(ref_geom, geom, &kr, r), "curve");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_edge_curvature(ref_grid, geom, &kr, r), "curve");
      } else {
        continue;
      }
      /* ignore sign, curvature is 1 / radius */
      kr = ABS(kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;

      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_geom_reliability(ref_geom, geom, &slop), "edge tol");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_gap(ref_grid, node, &slop), "edge tol");
        slop *= ref_geom_gap_protection(ref_geom);
      } else {
        slop = 1.0e-5 * hmax;
      }
      if (hr < slop) continue;

      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_geom_crease(ref_grid, node, &crease_dot_prod), "crease");
        if (crease_dot_prod < -0.8) {
          ramp = (-crease_dot_prod - 0.8) / 0.2;
          scale = 0.25 * ramp + 1.0 * (1.0 - ramp);
          hr *= scale;
        }
      }

      ref_matrix_vec(diagonal_system, 0, 0) = 1.0;
      ref_matrix_vec(diagonal_system, 1, 0) = 0.0;
      ref_matrix_vec(diagonal_system, 2, 0) = 0.0;
      ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;

      ref_matrix_vec(diagonal_system, 0, 1) = 0.0;
      ref_matrix_vec(diagonal_system, 1, 1) = 1.0;
      ref_matrix_vec(diagonal_system, 2, 1) = 0.0;
      ref_matrix_eig(diagonal_system, 1) = 1.0 / hr / hr;

      ref_matrix_vec(diagonal_system, 0, 2) = 0.0;
      ref_matrix_vec(diagonal_system, 1, 2) = 0.0;
      ref_matrix_vec(diagonal_system, 2, 2) = 1.0;
      ref_matrix_eig(diagonal_system, 2) = 1.0 / hr / hr;

      /* form and intersect with previous */
      RSS(ref_matrix_form_m(diagonal_system, curvature_metric), "reform m");
      for (i = 0; i < 6; i++) previous_metric[i] = metric[i + 6 * node];
      RSS(ref_matrix_intersect(previous_metric, curvature_metric,
                               &(metric[6 * node])),
          "intersect to update metric");
    }
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        RSS(ref_matrix_twod_m(&(metric[6 * node])), "enforce twod");
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}